

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.cc
# Opt level: O1

bool __thiscall
CoreML::Specification::NonMaximumSuppressionLayerParams::MergePartialFromCodedStream
          (NonMaximumSuppressionLayerParams *this,CodedInputStream *input)

{
  byte bVar1;
  uint8 uVar2;
  byte *pbVar3;
  uint8 *puVar4;
  bool bVar5;
  uint32 uVar6;
  undefined8 in_RAX;
  int iVar7;
  char cVar8;
  ulong uVar9;
  int iVar10;
  pair<unsigned_long,_bool> pVar11;
  undefined8 local_38;
  
  local_38 = in_RAX;
  do {
    pbVar3 = input->buffer_;
    uVar6 = 0;
    if (pbVar3 < input->buffer_end_) {
      bVar1 = *pbVar3;
      uVar6 = (uint32)bVar1;
      if ((char)bVar1 < '\x01') goto LAB_003bffcc;
      input->buffer_ = pbVar3 + 1;
      uVar9 = (ulong)bVar1 | 0x100000000;
    }
    else {
LAB_003bffcc:
      uVar6 = google::protobuf::io::CodedInputStream::ReadTagFallback(input,uVar6);
      uVar9 = 0;
      if (uVar6 - 1 < 0x7f) {
        uVar9 = 0x100000000;
      }
      uVar9 = uVar6 | uVar9;
    }
    uVar6 = (uint32)uVar9;
    iVar10 = 6;
    iVar7 = iVar10;
    if ((uVar9 & 0x100000000) == 0) goto switchD_003c0030_default;
    cVar8 = (char)uVar9;
    switch((uint)(uVar9 >> 3) & 0x1fffffff) {
    case 1:
      if (cVar8 != '\r') break;
      puVar4 = input->buffer_;
      if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
        bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                          (input,(uint32 *)&local_38);
        if (!bVar5) goto LAB_003c0014;
      }
      else {
        local_38 = CONCAT44(local_38._4_4_,*(undefined4 *)puVar4);
        input->buffer_ = puVar4 + 4;
      }
      this->iouthreshold_ = (float)local_38;
      goto LAB_003c0012;
    case 2:
      if (cVar8 == '\x15') {
        puVar4 = input->buffer_;
        if (*(int *)&input->buffer_end_ - (int)puVar4 < 4) {
          bVar5 = google::protobuf::io::CodedInputStream::ReadLittleEndian32Fallback
                            (input,(uint32 *)((long)&local_38 + 4));
          if (!bVar5) goto LAB_003c0014;
        }
        else {
          local_38 = CONCAT44(*(undefined4 *)puVar4,(float)local_38);
          input->buffer_ = puVar4 + 4;
        }
        this->scorethreshold_ = local_38._4_4_;
        goto LAB_003c0012;
      }
      break;
    case 3:
      if (cVar8 == '\x18') {
        puVar4 = input->buffer_;
        if ((puVar4 < input->buffer_end_) && (-1 < (long)(char)*puVar4)) {
          this->maxboxes_ = (long)(char)*puVar4;
          input->buffer_ = puVar4 + 1;
        }
        else {
          pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
          this->maxboxes_ = pVar11.first;
          if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) == (undefined1  [16])0x0)
          goto LAB_003c0014;
        }
        goto LAB_003c0012;
      }
      break;
    case 4:
      if (cVar8 != ' ') break;
      puVar4 = input->buffer_;
      if ((puVar4 < input->buffer_end_) && (uVar2 = *puVar4, -1 < (long)(char)uVar2)) {
        input->buffer_ = puVar4 + 1;
        pVar11._8_8_ = 1;
        pVar11.first = (long)(char)uVar2;
      }
      else {
        pVar11 = google::protobuf::io::CodedInputStream::ReadVarint64Fallback(input);
      }
      if (((undefined1  [16])pVar11 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
        this->perclasssuppression_ = pVar11.first != 0;
        goto LAB_003c0012;
      }
      goto LAB_003c0014;
    }
switchD_003c0030_default:
    iVar7 = 7;
    if (((uVar6 & 7) != 4 && uVar6 != 0) &&
       (bVar5 = google::protobuf::internal::WireFormatLite::SkipField(input,uVar6), iVar7 = iVar10,
       bVar5)) {
LAB_003c0012:
      iVar7 = 0;
    }
LAB_003c0014:
    if (iVar7 != 0) {
      return iVar7 != 6;
    }
  } while( true );
}

Assistant:

bool NonMaximumSuppressionLayerParams::MergePartialFromCodedStream(
    ::google::protobuf::io::CodedInputStream* input) {
#define DO_(EXPRESSION) if (!GOOGLE_PREDICT_TRUE(EXPRESSION)) goto failure
  ::google::protobuf::uint32 tag;
  // @@protoc_insertion_point(parse_start:CoreML.Specification.NonMaximumSuppressionLayerParams)
  for (;;) {
    ::std::pair< ::google::protobuf::uint32, bool> p = input->ReadTagWithCutoffNoLastTag(127u);
    tag = p.first;
    if (!p.second) goto handle_unusual;
    switch (::google::protobuf::internal::WireFormatLite::GetTagFieldNumber(tag)) {
      // float iouThreshold = 1;
      case 1: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(13u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &iouthreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // float scoreThreshold = 2;
      case 2: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(21u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   float, ::google::protobuf::internal::WireFormatLite::TYPE_FLOAT>(
                 input, &scorethreshold_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // uint64 maxBoxes = 3;
      case 3: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(24u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   ::google::protobuf::uint64, ::google::protobuf::internal::WireFormatLite::TYPE_UINT64>(
                 input, &maxboxes_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      // bool perClassSuppression = 4;
      case 4: {
        if (static_cast< ::google::protobuf::uint8>(tag) ==
            static_cast< ::google::protobuf::uint8>(32u)) {

          DO_((::google::protobuf::internal::WireFormatLite::ReadPrimitive<
                   bool, ::google::protobuf::internal::WireFormatLite::TYPE_BOOL>(
                 input, &perclasssuppression_)));
        } else {
          goto handle_unusual;
        }
        break;
      }

      default: {
      handle_unusual:
        if (tag == 0 ||
            ::google::protobuf::internal::WireFormatLite::GetTagWireType(tag) ==
            ::google::protobuf::internal::WireFormatLite::WIRETYPE_END_GROUP) {
          goto success;
        }
        DO_(::google::protobuf::internal::WireFormatLite::SkipField(input, tag));
        break;
      }
    }
  }
success:
  // @@protoc_insertion_point(parse_success:CoreML.Specification.NonMaximumSuppressionLayerParams)
  return true;
failure:
  // @@protoc_insertion_point(parse_failure:CoreML.Specification.NonMaximumSuppressionLayerParams)
  return false;
#undef DO_
}